

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.yy.c
# Opt level: O0

void yy_delete_buffer(YY_BUFFER_STATE b,yyscan_t yyscanner)

{
  YY_BUFFER_STATE local_30;
  yyguts_t *yyg;
  yyscan_t yyscanner_local;
  YY_BUFFER_STATE b_local;
  
  if (b != (YY_BUFFER_STATE)0x0) {
    if (*(long *)((long)yyscanner + 0x28) == 0) {
      local_30 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_30 = *(YY_BUFFER_STATE *)
                  (*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
    }
    if (b == local_30) {
      *(undefined8 *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) = 0
      ;
    }
    if (b->yy_is_our_buffer != 0) {
      yyfree(b->yy_ch_buf,yyscanner);
    }
    yyfree(b,yyscanner);
  }
  return;
}

Assistant:

void yy_delete_buffer (YY_BUFFER_STATE  b , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	if ( ! b )
		return;

	if ( b == YY_CURRENT_BUFFER ) /* Not sure if we should pop here. */
		YY_CURRENT_BUFFER_LVALUE = (YY_BUFFER_STATE) 0;

	if ( b->yy_is_our_buffer )
		yyfree( (void *) b->yy_ch_buf , yyscanner );

	yyfree( (void *) b , yyscanner );
}